

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdSArray.h
# Opt level: O2

void __thiscall
HACD::SArray<long,_16UL>::operator=(SArray<long,_16UL> *this,SArray<long,_16UL> *rhs)

{
  SArray<long,_16UL> *__dest;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  __dest = (SArray<long,_16UL> *)this->m_data;
  uVar1 = this->m_maxSize;
  uVar3 = rhs->m_size;
  if (uVar1 < uVar3) {
    if (__dest != (SArray<long,_16UL> *)0x0) {
      operator_delete__(__dest);
      uVar3 = rhs->m_size;
    }
    uVar1 = rhs->m_maxSize;
    this->m_maxSize = uVar1;
    __dest = (SArray<long,_16UL> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->m_data = (long *)__dest;
    uVar2 = uVar1;
  }
  else {
    uVar2 = rhs->m_maxSize;
  }
  this->m_size = uVar3;
  if (uVar1 == 0x10) {
    __dest = this;
  }
  if (uVar2 != 0x10) {
    rhs = (SArray<long,_16UL> *)rhs->m_data;
  }
  memcpy(__dest,rhs,uVar3 << 3);
  return;
}

Assistant:

void                    operator=(const SArray & rhs)       
                                    {
                                        if (m_maxSize < rhs.m_size)
                                        {
                                            delete [] m_data;
                                            m_maxSize = rhs.m_maxSize;
                                            m_data = new T[m_maxSize];
                                        }
                                        m_size = rhs.m_size;
                                        memcpy(Data(), rhs.Data(), m_size*sizeof(T));
                                    }